

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O1

void __thiscall cppcms::cache_interface::cache_interface(cache_interface *this,context *context)

{
  _Rb_tree_header *p_Var1;
  cache_pool cVar2;
  base_cache *tmp;
  service *this_00;
  cache_pool local_38;
  intrusive_ptr<cppcms::impl::base_cache> local_30;
  
  (this->d).ptr_ = (_data *)0x0;
  this->context_ = context;
  p_Var1 = &(this->triggers_)._M_t._M_impl.super__Rb_tree_header;
  (this->triggers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->triggers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->triggers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->triggers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->triggers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->recorders_)._M_t._M_impl.super__Rb_tree_header;
  (this->recorders_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->recorders_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->recorders_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->recorders_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->recorders_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->cache_module_).p_ = (base_cache *)0x0;
  this->field_0x78 = this->field_0x78 & 0xfe;
  this_00 = http::context::service(context);
  service::cache_pool(this_00);
  cache_pool::get(&local_38);
  cVar2.d.ptr_ = local_38.d.ptr_;
  local_38.d.ptr_ = (hold_ptr<cppcms::cache_pool::_data>)(_data *)0x0;
  local_30.p_ = (this->cache_module_).p_;
  (this->cache_module_).p_ = (base_cache *)cVar2.d.ptr_;
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_30);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)&local_38);
  return;
}

Assistant:

cache_interface::cache_interface(http::context &context) :
	context_(&context),
	page_compression_used_(0)
{
	cache_module_ = context_->service().cache_pool().get();
}